

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FileDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  int i_1;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  int i_4;
  long lVar10;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"syntax = \"proto2\";\n\n",
             (allocator<char> *)&public_dependencies);
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_range_unique<int*>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &public_dependencies,*(int **)(this + 0x30),
             *(int **)(this + 0x30) + *(int *)(this + 0x28));
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_range_unique<int*>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &weak_dependencies,*(int **)(this + 0x40),
             *(int **)(this + 0x40) + *(int *)(this + 0x38));
  iVar4 = 0;
  while (local_f0.text_ = (char *)CONCAT44(local_f0.text_._4_4_,iVar4),
        iVar4 < *(int *)(this + 0x18)) {
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&public_dependencies,(key_type *)&local_f0);
    if (sVar5 == 0) {
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&weak_dependencies,(key_type *)&local_f0);
      if (sVar5 == 0) {
        puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + (long)(int)local_f0.text_ * 8);
        groups._M_t._M_impl._0_8_ = *puVar1;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar1 + 1);
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,&local_180,
                   &local_120,&local_150,&local_1b0,&local_1e0,&local_210,&local_240,&local_270,
                   &local_2a0);
      }
      else {
        puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + (long)(int)local_f0.text_ * 8);
        groups._M_t._M_impl._0_8_ = *puVar1;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar1 + 1);
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                   &local_180,&local_120,&local_150,&local_1b0,&local_1e0,&local_210,&local_240,
                   &local_270,&local_2a0);
      }
    }
    else {
      puVar1 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + (long)(int)local_f0.text_ * 8);
      groups._M_t._M_impl._0_8_ = *puVar1;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = *(_Rb_tree_color *)(puVar1 + 1)
      ;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                 &local_180,&local_120,&local_150,&local_1b0,&local_1e0,&local_210,&local_240,
                 &local_270,&local_2a0);
    }
    iVar4 = (int)local_f0.text_ + 1;
  }
  lVar8 = (*(undefined8 **)(this + 8))[1];
  if (lVar8 != 0) {
    groups._M_t._M_impl._0_8_ = **(undefined8 **)(this + 8);
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_270.text_ = (char *)0x0;
    local_270.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)lVar8;
    local_2a0.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",(SubstituteArg *)&groups,&local_180,
               &local_120,&local_150,&local_1b0,&local_1e0,&local_210,&local_240,&local_270,
               &local_2a0);
  }
  bVar3 = anon_unknown_1::FormatLineOptions(0,*(Message **)(this + 0x88),__return_storage_ptr__);
  if (bVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x58); lVar9 = lVar9 + 1) {
    EnumDescriptor::DebugString
              ((EnumDescriptor *)(*(long *)(this + 0x60) + lVar8),0,__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar8 = lVar8 + 0x38;
  }
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groups._M_t._M_impl.super__Rb_tree_header._M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar8 = 0x48;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x78); lVar9 = lVar9 + 1) {
    if (*(int *)(*(long *)(this + 0x80) + -0x1c + lVar8) == 10) {
      local_180.text_ = *(char **)(*(long *)(this + 0x80) + lVar8);
      std::
      _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
      ::_M_insert_unique<google::protobuf::Descriptor_const*>
                ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&groups,(Descriptor **)&local_180);
    }
    lVar8 = lVar8 + 0x78;
  }
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x48); lVar9 = lVar9 + 1) {
    local_180.text_ = (char *)(*(long *)(this + 0x50) + lVar8);
    sVar6 = std::
            set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count(&groups,(key_type *)&local_180);
    if (sVar6 == 0) {
      local_180.text_ = (char *)**(long **)(*(long *)(this + 0x50) + lVar8);
      local_180.size_ = (int)(*(long **)(*(long *)(this + 0x50) + lVar8))[1];
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"message $0",&local_180,&local_120,&local_150,&local_1b0,
                 &local_1e0,&local_210,&local_240,&local_270,&local_2a0,&local_f0);
      Descriptor::DebugString
                ((Descriptor *)(*(long *)(this + 0x50) + lVar8),0,__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    lVar8 = lVar8 + 0x78;
  }
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x68); lVar9 = lVar9 + 1) {
    ServiceDescriptor::DebugString
              ((ServiceDescriptor *)(*(long *)(this + 0x70) + lVar8),__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar8 = lVar8 + 0x30;
  }
  lVar9 = 0;
  lVar8 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(this + 0x78); lVar10 = lVar10 + 1) {
    lVar7 = *(long *)(this + 0x80);
    lVar2 = *(long *)(lVar7 + 0x38 + lVar9);
    if (lVar2 != lVar8) {
      lVar8 = lVar2;
      if (lVar9 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar8 = *(long *)(*(long *)(this + 0x80) + 0x38 + lVar9);
      }
      local_180.text_ = (char *)**(long **)(lVar8 + 8);
      local_180.size_ = (int)(*(long **)(lVar8 + 8))[1];
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"extend .$0 {\n",&local_180,&local_120,&local_150,&local_1b0
                 ,&local_1e0,&local_210,&local_240,&local_270,&local_2a0,&local_f0);
      lVar7 = *(long *)(this + 0x80);
    }
    FieldDescriptor::DebugString((FieldDescriptor *)(lVar7 + lVar9),1,__return_storage_ptr__);
    lVar9 = lVar9 + 0x78;
  }
  if (0 < *(int *)(this + 0x78)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugString() const {
  string contents = "syntax = \"proto2\";\n\n";

  set<int> public_dependencies;
  set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
  }

  if (FormatLineOptions(0, options(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      strings::SubstituteAndAppend(&contents, "message $0",
                                   message_type(i)->name());
      message_type(i)->DebugString(0, &contents);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  return contents;
}